

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O0

int Cudd_MinHammingDist(DdManager *dd,DdNode *f,int *minterm,int upperBound)

{
  DdHashTable *table_00;
  double ep;
  int res;
  double epsilon;
  DdHashTable *table;
  int upperBound_local;
  int *minterm_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  table_00 = cuddHashTableInit(dd,1,2);
  if (table_00 == (DdHashTable *)0x0) {
    dd_local._4_4_ = -1;
  }
  else {
    ep = Cudd_ReadEpsilon(dd);
    Cudd_SetEpsilon(dd,0.0);
    dd_local._4_4_ = cuddMinHammingDistRecur(f,minterm,table_00,upperBound);
    cuddHashTableQuit(table_00);
    Cudd_SetEpsilon(dd,ep);
  }
  return dd_local._4_4_;
}

Assistant:

int
Cudd_MinHammingDist(
  DdManager *dd /* DD manager */,
  DdNode *f /* function to examine */,
  int *minterm /* reference minterm */,
  int upperBound /* distance above which an approximate answer is OK */)
{
    DdHashTable *table;
    CUDD_VALUE_TYPE epsilon;
    int res;

    table = cuddHashTableInit(dd,1,2);
    if (table == NULL) {
        return(CUDD_OUT_OF_MEM);
    }
    epsilon = Cudd_ReadEpsilon(dd);
    Cudd_SetEpsilon(dd,(CUDD_VALUE_TYPE)0.0);
    res = cuddMinHammingDistRecur(f,minterm,table,upperBound);
    cuddHashTableQuit(table);
    Cudd_SetEpsilon(dd,epsilon);

    return(res);

}